

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

string * __thiscall
spectest::JSONParser::CreateModulePath_abi_cxx11_
          (string *__return_storage_ptr__,JSONParser *this,string_view filename)

{
  ulong __n;
  size_type sVar1;
  char *in_R8;
  string_view y;
  string_view x;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view filename_local;
  string local_60;
  string local_40;
  
  filename_local._M_str = filename._M_str;
  filename_local._M_len = filename._M_len;
  local_60._M_dataplus._M_p = (pointer)(this->loc_).filename._M_len;
  local_60._M_string_length = (size_type)(this->loc_).filename._M_str;
  __n = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_60,'/',
                   0xffffffffffffffff);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_60,'\\',
                     0xffffffffffffffff);
  if (__n == 0xffffffffffffffff) {
    __n = 0;
  }
  if (sVar1 == 0xffffffffffffffff) {
    sVar1 = 0;
  }
  if (__n <= sVar1) {
    __n = sVar1;
  }
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_60,0,__n);
  x._M_len = bVar2._M_str;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((wabt *)bVar2._M_len == (wabt *)0x0) {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_60,&filename_local,(allocator<char> *)&local_40);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
  }
  else {
    x._M_str = "/";
    wabt::operator+[abi_cxx11_(&local_40,(wabt *)bVar2._M_len,x,in_R8);
    y._M_str = in_R8;
    y._M_len = (size_t)filename_local._M_str;
    wabt::operator+(&local_60,(wabt *)&local_40,(string *)filename_local._M_len,y);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::_M_dispose();
  wabt::ConvertBackslashToSlash(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string JSONParser::CreateModulePath(std::string_view filename) {
  std::string_view spec_json_filename = loc_.filename;
  std::string_view dirname = GetDirname(spec_json_filename);
  std::string path;

  if (dirname.size() == 0) {
    path = std::string(filename);
  } else {
    path = dirname + "/" + filename;
  }

  ConvertBackslashToSlash(&path);
  return path;
}